

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_andc_i64_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 ret_00;
  TCGv_i64 t0;
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict3 *tcg_ctx_local;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_not_i64_mips(tcg_ctx,ret_00,arg2);
  tcg_gen_and_i64_mips(tcg_ctx,ret,arg1,ret_00);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_andc_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_andc_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), TCGV_LOW(tcg_ctx, arg2));
        tcg_gen_andc_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), TCGV_HIGH(tcg_ctx, arg2));
#elif TCG_TARGET_HAS_andc_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_andc_i64, ret, arg1, arg2);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_not_i64(tcg_ctx, t0, arg2);
        tcg_gen_and_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
}